

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::setCommandNibble(MidiMessage *this,int value)

{
  byte *pbVar1;
  byte bVar2;
  
  if ((this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  }
  pbVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = (byte)value & 0xf0;
  if (value < 0x10) {
    bVar2 = (byte)value << 4;
  }
  *pbVar1 = bVar2 | *pbVar1 & 0xf;
  return;
}

Assistant:

void MidiMessage::setCommandNibble(int value) {
	if (this->size() < 1) {
		this->resize(1);
	}
	if (value <= 0x0f) {
		(*this)[0] = ((*this)[0] & 0x0f) | ((uchar)((value << 4) & 0xf0));
	} else {
		(*this)[0] = ((*this)[0] & 0x0f) | ((uchar)(value & 0xf0));
	}
}